

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

void __thiscall
glcts::anon_unknown_0::UniformLocNegativeLinkMaxLocation::~UniformLocNegativeLinkMaxLocation
          (UniformLocNegativeLinkMaxLocation *this)

{
  UniformLocNegativeLinkMaxLocation *this_local;
  
  ExplicitUniformLocationCaseBase::~ExplicitUniformLocationCaseBase
            (&this->super_ExplicitUniformLocationCaseBase);
  return;
}

Assistant:

virtual long Run()
	{
		//layout (location = X) uniform float u0;
		//Where X is substituted with value of GL_MAX_UNIFORM_LOCATIONS.

		GLint max;
		glGetIntegerv(GL_MAX_UNIFORM_LOCATIONS, &max);

		std::vector<Uniform> uniforms;
		uniforms.push_back(Uniform(uniformValueGenerator, GL_FLOAT_VEC4, Loc::C(max), DefOccurence::FSH_OR_CSH));

		return doRunNegativeLink(uniforms);
	}